

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O3

void __thiscall
FxConstant::FxConstant(FxConstant *this,PType *type,VMValue *vmval,FScriptPosition *pos)

{
  anon_union_8_3_addc324a_for_ExpVal_1 *paVar1;
  VM_UBYTE VVar2;
  ExpVal local_40;
  
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ExprType = EFX_Constant;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
  paVar1 = &(this->value).field_1;
  (this->value).field_1.Int = 0;
  (this->value).Type = type;
  (this->super_FxExpression).ValueType = type;
  (this->super_FxExpression).isresolved = true;
  (this->super_FxExpression).NeedResult = true;
  VVar2 = (vmval->field_0).field_3.Type;
  if (VVar2 == '\x01') {
    *paVar1 = (anon_union_8_3_addc324a_for_ExpVal_1)(vmval->field_0).field_1.a;
  }
  else if (VVar2 == '\x02') {
    local_40.Type = (PType *)TypeString;
    FString::AttachToOther((FString *)&local_40.field_1,(FString *)vmval);
    ExpVal::operator=(&this->value,&local_40);
    if (local_40.Type == (PType *)TypeString) {
      FString::~FString((FString *)&local_40.field_1);
    }
  }
  else if (VVar2 == '\x03') {
    *paVar1 = (anon_union_8_3_addc324a_for_ExpVal_1)(vmval->field_0).field_1.a;
  }
  else {
    paVar1->Int = (vmval->field_0).i;
  }
  return;
}

Assistant:

FxConstant(PType *type, VMValue &vmval, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = type;
		isresolved = true;
		switch (vmval.Type)
		{
		default:
		case REGT_INT:
			value.Int = vmval.i;
			break;

		case REGT_FLOAT:
			value.Float = vmval.f;
			break;

		case REGT_STRING:
			value = ExpVal(vmval.s());
			break;

		case REGT_POINTER:
			value.pointer = vmval.a;
			break;
		}
	}